

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O3

void Vec_IntFill(Vec_Int_t *p,int nSize,int Fill)

{
  undefined1 auVar1 [16];
  int *piVar2;
  long lVar3;
  int iVar5;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  long lVar7;
  
  if (p->nCap < nSize) {
    if (p->pArray == (int *)0x0) {
      piVar2 = (int *)malloc((long)nSize << 2);
    }
    else {
      piVar2 = (int *)realloc(p->pArray,(long)nSize << 2);
    }
    p->pArray = piVar2;
    if (piVar2 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p->nCap = nSize;
  }
  auVar1 = _DAT_0094e250;
  if (0 < nSize) {
    piVar2 = p->pArray;
    lVar3 = (ulong)(uint)nSize - 1;
    auVar4._8_4_ = (int)lVar3;
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = (int)((ulong)lVar3 >> 0x20);
    lVar3 = 0;
    auVar4 = auVar4 ^ _DAT_0094e250;
    auVar6 = _DAT_0094f530;
    auVar8 = _DAT_0094e240;
    do {
      auVar9 = auVar8 ^ auVar1;
      iVar5 = auVar4._4_4_;
      if ((bool)(~(auVar9._4_4_ == iVar5 && auVar4._0_4_ < auVar9._0_4_ || iVar5 < auVar9._4_4_) & 1
                )) {
        *(int *)((long)piVar2 + lVar3) = Fill;
      }
      if ((auVar9._12_4_ != auVar4._12_4_ || auVar9._8_4_ <= auVar4._8_4_) &&
          auVar9._12_4_ <= auVar4._12_4_) {
        *(int *)((long)piVar2 + lVar3 + 4) = Fill;
      }
      auVar9 = auVar6 ^ auVar1;
      iVar10 = auVar9._4_4_;
      if (iVar10 <= iVar5 && (iVar10 != iVar5 || auVar9._0_4_ <= auVar4._0_4_)) {
        *(int *)((long)piVar2 + lVar3 + 8) = Fill;
        *(int *)((long)piVar2 + lVar3 + 0xc) = Fill;
      }
      lVar7 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 4;
      auVar8._8_8_ = lVar7 + 4;
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 4;
      auVar6._8_8_ = lVar7 + 4;
      lVar3 = lVar3 + 0x10;
    } while ((ulong)(nSize + 3U >> 2) << 4 != lVar3);
  }
  p->nSize = nSize;
  return;
}

Assistant:

static inline void Vec_IntFill( Vec_Int_t * p, int nSize, int Fill )
{
    int i;
    Vec_IntGrow( p, nSize );
    for ( i = 0; i < nSize; i++ )
        p->pArray[i] = Fill;
    p->nSize = nSize;
}